

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall kj::anon_unknown_9::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_c0;
  Fault f;
  SyscallResult local_a4;
  undefined1 local_a0 [4];
  SyscallResult _kjSyscallResult;
  stat stats;
  DiskHandle *this_local;
  
  f.exception = (Exception *)__file;
  local_a4 = kj::_::Debug::syscall<kj::(anonymous_namespace)::DiskHandle::stat()const::_lambda()_1_>
                       ((anon_class_16_2_f884058c *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_a4);
  if (pvVar1 != (void *)0x0) {
    statToMetadata((Metadata *)this,(stat *)local_a0);
    return (int)this;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_a4);
  kj::_::Debug::Fault::Fault
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x13d,osErrorNumber,"::fstat(fd, &stats)","");
  kj::_::Debug::Fault::fatal(&local_c0);
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }